

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe8At2(uint8_t *buf)

{
  return (ulong)(byte)(*buf << 2 | buf[1] >> 6);
}

Assistant:

std::uint64_t readFlUIntBe8At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 2;
    res |= (buf[1] >> 6);
    res &= UINT64_C(0xff);
    return res;
}